

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void is_item_discoverable(tgestate_t *state)

{
  byte bVar1;
  int iVar2;
  tgestate_t *in_RDI;
  item_t item;
  uint8_t iters;
  itemstruct_t *itemstruct;
  room_t room;
  char local_19;
  itemstruct_t *local_18;
  
  if (in_RDI->room_index == '\0') {
    local_18 = in_RDI->item_structs;
    local_19 = '\x10';
    do {
      if ((((local_18->room_and_flags & 0x80) != 0) &&
          (bVar1 = local_18->item_and_flags & 0xf, bVar1 != 0xb)) && (bVar1 != 7)) {
        hostiles_pursue(in_RDI);
        return;
      }
      local_18 = local_18 + 1;
      local_19 = local_19 + -1;
    } while (local_19 != '\0');
  }
  else {
    iVar2 = is_item_discoverable_interior(in_RDI,in_RDI->room_index,(item_t *)0x0);
    if (iVar2 == 0) {
      hostiles_pursue(in_RDI);
    }
  }
  return;
}

Assistant:

void is_item_discoverable(tgestate_t *state)
{
  room_t              room;       /* was A */
  const itemstruct_t *itemstruct; /* was HL */
  uint8_t             iters;      /* was B */
  item_t              item;       /* was A */

  assert(state != NULL);

  room = state->room_index;
  if (room != room_0_OUTDOORS)
  {
    /* Interior. */

    if (is_item_discoverable_interior(state, room, NULL) == 0)
      /* Item was found. */
      hostiles_pursue(state);
  }
  else
  {
    /* Exterior. */

    itemstruct = &state->item_structs[0];
    iters      = item__LIMIT;
    do
    {
      if (itemstruct->room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
        goto nearby;
next:
      itemstruct++;
    }
    while (--iters);
    return;

nearby:
    /* FUTURE: Merge into loop. */
    item = itemstruct->item_and_flags & itemstruct_ITEM_MASK;

    /* The green key and food items are ignored. */
    if (item == item_GREEN_KEY || item == item_FOOD)
      goto next;

    /* BUG FIX: In the original game the itemstruct pointer is decremented to
     * access item_and_flags but is not re-adjusted afterwards. */

    hostiles_pursue(state);
  }
}